

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdownhighlighter.cpp
# Opt level: O1

void __thiscall MarkdownHighlighter::cssHighlighter(MarkdownHighlighter *this,QString *text)

{
  char16_t cVar1;
  long lVar2;
  char16_t *pcVar3;
  int *piVar4;
  undefined1 auVar5 [14];
  char cVar6;
  CutResult CVar7;
  uint uVar8;
  CaseSensitivity CVar9;
  CaseSensitivity CVar10;
  int iVar11;
  int iVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  long lVar15;
  long lVar16;
  QTextFormat *pQVar17;
  CaseSensitivity CVar18;
  char16_t *pcVar19;
  QChar QVar20;
  wchar32 wVar21;
  int iVar22;
  ulong uVar23;
  QArrayData *pQVar24;
  ulong uVar25;
  QStringView QVar26;
  QLatin1String QVar27;
  QStringView QVar28;
  QStringView QVar29;
  QStringView QVar30;
  QLatin1String QVar31;
  undefined1 auVar32 [16];
  QString g;
  QString r;
  QTextCharFormat f;
  QColor c;
  QString color;
  QColor local_e0;
  qsizetype local_d0;
  anon_union_24_3_e3d07ef4_for_data local_c8;
  QArrayData *local_a8;
  storage_type_conflict *local_a0;
  qsizetype local_98;
  undefined1 local_90 [20];
  uint local_7c;
  MarkdownHighlighter *local_78;
  QBrush local_70 [8];
  QArrayData *local_68 [3];
  undefined8 local_50;
  undefined8 local_48;
  long local_40;
  undefined8 local_38;
  
  lVar2 = (text->d).size;
  if (0 < lVar2) {
    pQVar24 = (QArrayData *)0x0;
    CVar18 = CaseInsensitive;
    local_78 = this;
    do {
      pcVar3 = (text->d).ptr;
      cVar1 = pcVar3[(long)pQVar24];
      QVar20.ucs = (char16_t)text;
      if (cVar1 == L'#') {
LAB_00125a75:
        if (lVar2 <= (int)(CVar18 + CaseSensitive)) {
          return;
        }
        cVar1 = pcVar3[(int)(CVar18 + CaseSensitive)];
        if ((4 < (ushort)cVar1 - 9) && (cVar1 != L' ')) {
          wVar21 = (wchar32)(ushort)cVar1;
          if ((ushort)cVar1 < 0x80) {
            if (9 < (ushort)cVar1 - 0x30) goto LAB_00125bea;
          }
          else if (((wVar21 != L'\x85') && (wVar21 != L'\xa0')) &&
                  (cVar6 = QChar::isSpace_helper((uint)(ushort)cVar1),
                  9 < (ushort)cVar1 - 0x30 && cVar6 == '\0')) {
LAB_00125bea:
            if (((ushort)cVar1 < 0x80) || (cVar6 = QChar::isNumber_helper(wVar21), cVar6 == '\0')) {
              CVar9 = QString::indexOf(QVar20,0x20,(CaseSensitivity)pQVar24);
              if (((int)CVar9 < 0) &&
                 (CVar9 = QString::indexOf(QVar20,0x7b,(CaseSensitivity)pQVar24), (int)CVar9 < 0)) {
                CVar9 = (CaseSensitivity)lVar2;
              }
              local_c8._0_4_ = 1000;
              QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[]
                        (&_formats,(HighlighterState *)local_c8.data);
              QSyntaxHighlighter::setFormat
                        ((int)local_78,CVar18,(QTextCharFormat *)(ulong)(CVar9 - CVar18));
              CVar18 = CVar9;
            }
          }
        }
      }
      else if (cVar1 == L'c') {
        local_68[0] = (QArrayData *)&DAT_00000005;
        local_c8.shared = (PrivateShared *)pQVar24;
        CVar7 = QtPrivate::QContainerImplHelper::mid
                          ((text->d).size,(qsizetype *)local_c8.data,(qsizetype *)local_68);
        pQVar24 = local_68[0];
        if (CVar7 == Null) {
          pQVar24 = (QArrayData *)0x0;
        }
        if (pQVar24 == (QArrayData *)&DAT_00000005) {
          pcVar19 = (char16_t *)0x0;
          if (CVar7 != Null) {
            pcVar19 = pcVar3 + (long)local_c8._forAlignment;
          }
          QVar26.m_data = pcVar19;
          QVar26.m_size = 5;
          QVar31.m_data = "color";
          QVar31.m_size = 5;
          cVar6 = QtPrivate::equalStrings(QVar26,QVar31);
          if (cVar6 != '\0') {
            CVar18 = CVar18 + 5;
            uVar8 = QString::indexOf(QVar20,0x3a,CVar18);
            if (-1 < (int)uVar8) {
              CVar9 = uVar8 + CaseSensitive;
              CVar18 = CVar9;
              if ((long)(ulong)CVar9 < lVar2) {
                pcVar3 = (text->d).ptr;
                uVar23 = (ulong)(uVar8 & 0x7fffffff) + 1;
                uVar25 = (ulong)CVar9;
                do {
                  cVar1 = pcVar3[uVar25];
                  if (((4 < (ushort)cVar1 - 9) && (cVar1 != L' ')) &&
                     (((ushort)cVar1 < 0x80 ||
                      (((wVar21 = (wchar32)(ushort)cVar1, wVar21 != L'\x85' && (wVar21 != L'\xa0'))
                       && (cVar6 = QChar::isSpace_helper(wVar21), cVar6 == '\0')))))) break;
                  uVar23 = uVar23 + 1;
                  uVar25 = uVar23;
                } while ((long)uVar23 < lVar2);
                CVar9 = (CaseSensitivity)uVar25;
                CVar18 = (CaseSensitivity)uVar23;
              }
              CVar10 = QString::indexOf(QVar20,0x3b,CVar9);
              if ((int)CVar10 < 0) {
                CVar10 = (CaseSensitivity)lVar2;
              }
              local_7c = CVar10 - CVar18;
              QString::mid((longlong)local_68,(longlong)text);
              QColor::setNamedColor((QString *)local_90);
              QVar27.m_data = (char *)0x3;
              QVar27.m_size = (qsizetype)local_68;
              cVar6 = QString::startsWith(QVar27,0x14fd4d);
              if (cVar6 != '\0') {
                uVar13 = QString::indexOf(QVar20,0x28,CVar9);
                CVar9 = QString::indexOf(QVar20,0x2c,(CaseSensitivity)uVar13);
                local_40 = (long)(int)(CVar9 + CaseSensitive);
                local_38 = uVar13;
                uVar13 = QString::indexOf(QVar20,0x2c,CVar9 + CaseSensitive);
                uVar14 = QString::indexOf(QVar20,0x29,(CaseSensitivity)uVar13);
                if ((int)((CaseSensitivity)uVar13 | CVar9 | (CaseSensitivity)uVar14) < 0) {
                  local_e0.cspec = ~Invalid;
                  QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[]
                            (&_formats,(HighlighterState *)&local_e0);
                  QTextFormat::brushProperty((int)&local_c8);
                  local_90._0_4_ = (undefined4)*(qsizetype *)(local_c8.shared + 8);
                  local_90._4_2_ = (undefined2)((ulong)*(qsizetype *)(local_c8.shared + 8) >> 0x20);
                  local_90._6_2_ = (undefined2)*(undefined8 *)(local_c8.shared + 0xe);
                  local_90._8_6_ =
                       (undefined6)((ulong)*(undefined8 *)(local_c8.shared + 0xe) >> 0x10);
                  QBrush::~QBrush((QBrush *)local_c8.data);
                }
                else {
                  local_50 = uVar14;
                  local_48 = uVar13;
                  QString::mid((longlong)&local_c8,(longlong)text);
                  QString::mid((longlong)&local_e0,(longlong)text);
                  QString::mid((longlong)&local_a8,(longlong)text);
                  QVar28.m_data = (storage_type_conflict *)local_c8._8_8_;
                  QVar28.m_size = local_c8._16_8_;
                  lVar15 = QString::toIntegral_helper(QVar28,(bool *)0x0,10);
                  iVar12 = (int)lVar15;
                  if (iVar12 != lVar15) {
                    iVar12 = 0;
                  }
                  QVar29.m_data._4_2_ = local_e0.ct.argb.pad;
                  QVar29.m_data._0_4_ = local_e0.ct._4_4_;
                  QVar29.m_data._6_2_ = local_e0._14_2_;
                  QVar29.m_size = local_d0;
                  lVar15 = QString::toIntegral_helper(QVar29,(bool *)0x0,10);
                  QVar30.m_data = local_a0;
                  QVar30.m_size = local_98;
                  lVar16 = QString::toIntegral_helper(QVar30,(bool *)0x0,10);
                  iVar22 = (int)lVar15;
                  if (iVar22 != lVar15) {
                    iVar22 = 0;
                  }
                  iVar11 = (int)lVar16;
                  if (iVar11 != lVar16) {
                    iVar11 = 0;
                  }
                  QColor::setRgb((int)local_90,iVar12,iVar22,iVar11);
                  if (local_a8 != (QArrayData *)0x0) {
                    LOCK();
                    (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
                         (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(local_a8,2,8);
                    }
                  }
                  piVar4 = (int *)CONCAT26(local_e0.ct.argb.red,
                                           CONCAT24(local_e0.ct.argb.alpha,local_e0.cspec));
                  if (piVar4 != (int *)0x0) {
                    LOCK();
                    *piVar4 = *piVar4 + -1;
                    UNLOCK();
                    if (*piVar4 == 0) {
                      QArrayData::deallocate
                                ((QArrayData *)
                                 CONCAT26(local_e0.ct.argb.red,
                                          CONCAT24(local_e0.ct.argb.alpha,local_e0.cspec)),2,8);
                    }
                  }
                  if ((QArrayData *)local_c8.shared != (QArrayData *)0x0) {
                    LOCK();
                    *(int *)local_c8.shared = *(int *)local_c8.shared + -1;
                    UNLOCK();
                    if (*(int *)local_c8.shared == 0) {
                      QArrayData::deallocate((QArrayData *)local_c8.shared,2,8);
                    }
                  }
                }
              }
              if (local_90._0_4_ != Invalid) {
                local_e0.cspec = Invalid;
                local_e0.ct.argb.alpha = 0xffff;
                local_e0.ct.argb.red = 0;
                local_e0.ct._4_4_ = 0;
                local_e0.ct.argb.pad = 0;
                iVar12 = QColor::lightness();
                if (iVar12 < 0x15) {
                  QColor::operator=(&local_e0,white);
                }
                else {
                  iVar12 = QColor::lightness();
                  if ((iVar12 < 0x15) || (iVar12 = QColor::lightness(), 0x33 < iVar12)) {
                    iVar12 = QColor::lightness();
                    if ((iVar12 < 0x34) || (iVar12 = QColor::lightness(), 0x6e < iVar12)) {
                      iVar12 = QColor::lightness();
                      QColor::lightness();
                      iVar22 = (int)(QColor *)local_90;
                      if (iVar12 < 0x80) {
                        auVar32 = QColor::lighter(iVar22);
                        auVar5 = auVar32._0_14_;
                      }
                      else {
                        auVar32 = QColor::darker(iVar22);
                        auVar5 = auVar32._0_14_;
                      }
                      local_e0.cspec = auVar5._0_4_;
                      local_e0.ct.argb.alpha = auVar5._4_2_;
                      local_e0.ct.argb.red = auVar5._6_2_;
                      local_e0.ct._4_4_ = auVar5._8_4_;
                      local_e0.ct.argb.pad = auVar5._12_2_;
                      goto LAB_00126017;
                    }
                    uVar13 = 0xbbbbbbbbbbbbffff;
                  }
                  else {
                    uVar13 = 0xccccccccccccffff;
                  }
                  local_e0.cspec = Rgb;
                  local_e0.ct.argb.alpha = (ushort)uVar13;
                  local_e0.ct.argb.red = (ushort)((ulong)uVar13 >> 0x10);
                  local_e0.ct._4_4_ = (undefined4)((ulong)uVar13 >> 0x20);
                  local_e0.ct.argb.pad = 0;
                }
LAB_00126017:
                local_c8._0_4_ = 4;
                pQVar17 = &QHash<MarkdownHighlighter::HighlighterState,_QTextCharFormat>::operator[]
                                     (&_formats,(HighlighterState *)local_c8.data)->
                           super_QTextFormat;
                QTextFormat::QTextFormat((QTextFormat *)&local_a8,pQVar17);
                QBrush::QBrush(local_70,(QColor *)local_90,SolidPattern);
                QBrush::operator_cast_to_QVariant((QVariant *)&local_c8,local_70);
                QTextFormat::setProperty((int)&local_a8,(QVariant *)0x820);
                QVariant::~QVariant((QVariant *)&local_c8);
                QBrush::~QBrush(local_70);
                QBrush::QBrush(local_70,&local_e0,SolidPattern);
                QBrush::operator_cast_to_QVariant((QVariant *)&local_c8,local_70);
                QTextFormat::setProperty((int)&local_a8,(QVariant *)0x821);
                QVariant::~QVariant((QVariant *)&local_c8);
                QBrush::~QBrush(local_70);
                QTextCharFormat::QTextCharFormat((QTextCharFormat *)&local_c8);
                uVar8 = local_7c;
                iVar12 = (int)local_78;
                QSyntaxHighlighter::setFormat(iVar12,CVar18,(QTextCharFormat *)(ulong)local_7c);
                QTextFormat::~QTextFormat((QTextFormat *)local_c8.data);
                QSyntaxHighlighter::setFormat(iVar12,CVar18,(QTextCharFormat *)(ulong)uVar8);
                QTextFormat::~QTextFormat((QTextFormat *)&local_a8);
                CVar18 = CVar10;
              }
              if (local_68[0] != (QArrayData *)0x0) {
                LOCK();
                (local_68[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                     (local_68[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((local_68[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(local_68[0],2,8);
                }
              }
            }
          }
        }
      }
      else if (cVar1 == L'.') goto LAB_00125a75;
      CVar18 = CVar18 + CaseSensitive;
      pQVar24 = (QArrayData *)(long)(int)CVar18;
    } while ((long)pQVar24 < lVar2);
  }
  return;
}

Assistant:

void MarkdownHighlighter::cssHighlighter(const QString &text) {
    if (text.isEmpty()) return;
    const auto textLen = text.length();
    for (int i = 0; i < textLen; ++i) {
        if (text[i] == QLatin1Char('.') || text[i] == QLatin1Char('#')) {
            if (i + 1 >= textLen) return;
            if (text[i + 1].isSpace() || text[i + 1].isNumber()) continue;
            int space = text.indexOf(QLatin1Char(' '), i);
            if (space < 0) {
                space = text.indexOf(QLatin1Char('{'), i);
                if (space < 0) {
                    space = textLen;
                }
            }
            setFormat(i, space - i, _formats[CodeKeyWord]);
            i = space;
        } else if (text[i] == QLatin1Char('c')) {
            if (MH_SUBSTR(i, 5) == QLatin1String("color")) {
                i += 5;
                const int colon = text.indexOf(QLatin1Char(':'), i);
                if (colon < 0) continue;
                i = colon;
                ++i;
                while (i < textLen) {
                    if (!text[i].isSpace()) break;
                    ++i;
                }
                int semicolon = text.indexOf(QLatin1Char(';'), i);
                if (semicolon < 0) semicolon = textLen;
                const QString color = text.mid(i, semicolon - i);
                QColor c(color);
                if (color.startsWith(QLatin1String("rgb"))) {
                    const int t = text.indexOf(QLatin1Char('('), i);
                    const int rPos = text.indexOf(QLatin1Char(','), t);
                    const int gPos = text.indexOf(QLatin1Char(','), rPos + 1);
                    const int bPos = text.indexOf(QLatin1Char(')'), gPos);
                    if (rPos > -1 && gPos > -1 && bPos > -1) {
                        const QString r = text.mid(t + 1, rPos - (t + 1));
                        const QString g = text.mid(rPos + 1, gPos - (rPos + 1));
                        const QString b = text.mid(gPos + 1, bPos - (gPos + 1));
                        c.setRgb(r.toInt(), g.toInt(), b.toInt());
                    } else {
                        c = _formats[HighlighterState::NoState]
                                .background()
                                .color();
                    }
                }

                if (!c.isValid()) {
                    continue;
                }

                int lightness{};
                QColor foreground;
                // really dark
                if (c.lightness() <= 20) {
                    foreground = Qt::white;
                } else if (c.lightness() > 20 && c.lightness() <= 51) {
                    foreground = QColor(204, 204, 204);
                } else if (c.lightness() > 51 && c.lightness() <= 110) {
                    foreground = QColor(187, 187, 187);
                } else if (c.lightness() > 127) {
                    lightness = c.lightness() + 100;
                    foreground = c.darker(lightness);
                } else {
                    lightness = c.lightness() + 100;
                    foreground = c.lighter(lightness);
                }

                QTextCharFormat f = _formats[CodeBlock];
                f.setBackground(c);
                f.setForeground(foreground);
                // clear prev format
                setFormat(i, semicolon - i, QTextCharFormat());
                setFormat(i, semicolon - i, f);
                i = semicolon;
            }
        }
    }
}